

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O1

void __thiscall
tcmalloc::anon_unknown_0::ChunkedStorageWriter::~ChunkedStorageWriter(ChunkedStorageWriter *this)

{
  char *pcVar1;
  Chunk *pCVar2;
  
  (this->super_GenericWriter)._vptr_GenericWriter =
       (_func_int **)&PTR__ChunkedStorageWriter_0014bec8;
  pcVar1 = (this->super_GenericWriter).buf_;
  pCVar2 = this->storage_->last_chunk;
  if (pCVar2 != (Chunk *)0x0) {
    pCVar2->used = *(int *)&(this->super_GenericWriter).buf_fill_ - (int)pcVar1;
  }
  (this->super_GenericWriter).buf_fill_ = pcVar1;
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__GenericWriter_0014be50;
  return;
}

Assistant:

~ChunkedStorageWriter() override {
    FinalRecycle();
  }